

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  void ***__rhs;
  PyTypeObject *type;
  long *plVar1;
  undefined7 in_register_00000009;
  size_type *psVar2;
  anon_union_24_2_63b86169_for_instance_1 *paVar3;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar4;
  undefined1 local_138 [8];
  iterator it;
  undefined1 local_e8 [8];
  values_and_holders vhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined4 local_38;
  allocator local_32;
  allocator local_31;
  
  if ((find_type == (type_info *)0x0) || (type = (this->ob_base).ob_type, type == find_type->type))
  {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
    if ((this->field_0x30 & 2) == 0) {
      paVar3 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
    }
    else {
      paVar3 = &this->field_1;
    }
    __return_storage_ptr__->vh = (void **)paVar3;
  }
  else {
    local_38 = (undefined4)CONCAT71(in_register_00000009,throw_if_missing);
    local_e8 = (undefined1  [8])this;
    pVar4 = all_type_info_get_cache(type);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      all_type_info_populate
                (type,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)((long)pVar4.first.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                ._M_cur.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                         + 0x10));
    }
    vhs.inst = (instance *)
               ((long)pVar4.first.
                      super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               + 0x10);
    values_and_holders::find((iterator *)local_138,(values_and_holders *)local_e8,find_type);
    if (CONCAT44(it.curr.inst._4_4_,it.curr.inst._0_4_) ==
        (long)((vhs.inst)->ob_base).ob_type - ((vhs.inst)->ob_base).ob_refcnt >> 3) {
      if ((char)local_38 != '\0') {
        __rhs = &it.curr.vh;
        std::__cxx11::string::string((string *)__rhs,find_type->type->tp_name,&local_32);
        std::operator+(&local_b8,"pybind11::detail::instance::get_value_and_holder: `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_58._M_dataplus._M_p = (pointer)*plVar1;
        psVar2 = (size_type *)(plVar1 + 2);
        if ((size_type *)local_58._M_dataplus._M_p == psVar2) {
          local_58.field_2._M_allocated_capacity = *psVar2;
          local_58.field_2._8_8_ = plVar1[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar2;
        }
        local_58._M_string_length = plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::string
                  ((string *)&local_98,((this->ob_base).ob_type)->tp_name,&local_31);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vhs.tinfo,&local_58,&local_98);
        plVar1 = (long *)std::__cxx11::string::append((char *)&vhs.tinfo);
        local_78._M_dataplus._M_p = (pointer)*plVar1;
        psVar2 = (size_type *)(plVar1 + 2);
        if ((size_type *)local_78._M_dataplus._M_p == psVar2) {
          local_78.field_2._M_allocated_capacity = *psVar2;
          local_78.field_2._8_8_ = plVar1[3];
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar2;
        }
        local_78._M_string_length = plVar1[1];
        *plVar1 = (long)psVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        pybind11_fail(&local_78);
      }
      it.types._0_4_ = 0;
      it.types._4_4_ = 0;
      it.curr.inst._0_4_ = 0;
      it.curr.inst._4_4_ = 0;
      __return_storage_ptr__->type = (type_info *)0x0;
      __return_storage_ptr__->vh = (void **)0x0;
    }
    else {
      __return_storage_ptr__->type = (type_info *)it.curr.index;
      __return_storage_ptr__->vh = &(it.curr.type)->type;
    }
    *(undefined4 *)&__return_storage_ptr__->inst = it.types._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->inst + 4) = it.types._4_4_;
    *(undefined4 *)&__return_storage_ptr__->index = it.curr.inst._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->index + 4) = it.curr.inst._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE inline value_and_holder instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/, bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type)
        return value_and_holder(this, find_type, 0, 0);

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end())
        return *it;

    if (!throw_if_missing)
        return value_and_holder();

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
            "type is not a pybind11 base of the given instance "
            "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `" +
            std::string(find_type->type->tp_name) + "' is not a pybind11 base of the given `" +
            std::string(Py_TYPE(this)->tp_name) + "' instance");
#endif
}